

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pow.cpp
# Opt level: O2

bool PermittedDifficultyTransition
               (Params *params,int64_t height,uint32_t old_nbits,uint32_t new_nbits)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  uint32_t uVar4;
  bool bVar5;
  long in_FS_OFFSET;
  arith_uint256 minimum_new_target;
  arith_uint256 smallest_difficulty_target;
  arith_uint256 maximum_new_target;
  arith_uint256 largest_difficulty_target;
  arith_uint256 observed_new_target;
  arith_uint256 pow_limit;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar5 = true;
  if (params->fPowAllowMinDifficultyBlocks == false) {
    lVar2 = params->nPowTargetTimespan;
    if (height % (lVar2 / params->nPowTargetSpacing) == 0) {
      UintToArith256(&pow_limit,&params->powLimit);
      base_uint<256U>::base_uint(&observed_new_target.super_base_uint<256U>);
      arith_uint256::SetCompact
                ((arith_uint256 *)&observed_new_target.super_base_uint<256U>,new_nbits,(bool *)0x0,
                 (bool *)0x0);
      base_uint<256U>::base_uint(&largest_difficulty_target.super_base_uint<256U>);
      arith_uint256::SetCompact
                ((arith_uint256 *)&largest_difficulty_target.super_base_uint<256U>,old_nbits,
                 (bool *)0x0,(bool *)0x0);
      base_uint<256U>::operator*=(&largest_difficulty_target.super_base_uint<256U>,(int)lVar2 << 2);
      base_uint<256U>::base_uint
                (&maximum_new_target.super_base_uint<256U>,params->nPowTargetTimespan);
      base_uint<256U>::operator/=
                (&largest_difficulty_target.super_base_uint<256U>,
                 &maximum_new_target.super_base_uint<256U>);
      bVar3 = operator>(&largest_difficulty_target.super_base_uint<256U>,
                        &pow_limit.super_base_uint<256U>);
      if (bVar3) {
        base_uint<256U>::operator=
                  (&largest_difficulty_target.super_base_uint<256U>,&pow_limit.super_base_uint<256U>
                  );
      }
      base_uint<256U>::base_uint(&maximum_new_target.super_base_uint<256U>);
      uVar4 = arith_uint256::GetCompact(&largest_difficulty_target,false);
      arith_uint256::SetCompact
                ((arith_uint256 *)&maximum_new_target.super_base_uint<256U>,uVar4,(bool *)0x0,
                 (bool *)0x0);
      bVar3 = operator<(&maximum_new_target.super_base_uint<256U>,
                        &observed_new_target.super_base_uint<256U>);
      if (!bVar3) {
        base_uint<256U>::base_uint(&smallest_difficulty_target.super_base_uint<256U>);
        arith_uint256::SetCompact
                  ((arith_uint256 *)&smallest_difficulty_target.super_base_uint<256U>,old_nbits,
                   (bool *)0x0,(bool *)0x0);
        base_uint<256U>::operator*=
                  (&smallest_difficulty_target.super_base_uint<256U>,(uint32_t)(lVar2 / 4));
        base_uint<256U>::base_uint
                  (&minimum_new_target.super_base_uint<256U>,params->nPowTargetTimespan);
        base_uint<256U>::operator/=
                  (&smallest_difficulty_target.super_base_uint<256U>,
                   &minimum_new_target.super_base_uint<256U>);
        bVar3 = operator>(&smallest_difficulty_target.super_base_uint<256U>,
                          &pow_limit.super_base_uint<256U>);
        if (bVar3) {
          base_uint<256U>::operator=
                    (&smallest_difficulty_target.super_base_uint<256U>,
                     &pow_limit.super_base_uint<256U>);
        }
        base_uint<256U>::base_uint(&minimum_new_target.super_base_uint<256U>);
        uVar4 = arith_uint256::GetCompact(&smallest_difficulty_target,false);
        arith_uint256::SetCompact
                  ((arith_uint256 *)&minimum_new_target.super_base_uint<256U>,uVar4,(bool *)0x0,
                   (bool *)0x0);
        bVar3 = operator>(&minimum_new_target.super_base_uint<256U>,
                          &observed_new_target.super_base_uint<256U>);
        if (!bVar3) goto LAB_0025a91a;
      }
    }
    else if (old_nbits == new_nbits) goto LAB_0025a91a;
    bVar5 = false;
  }
LAB_0025a91a:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool PermittedDifficultyTransition(const Consensus::Params& params, int64_t height, uint32_t old_nbits, uint32_t new_nbits)
{
    if (params.fPowAllowMinDifficultyBlocks) return true;

    if (height % params.DifficultyAdjustmentInterval() == 0) {
        int64_t smallest_timespan = params.nPowTargetTimespan/4;
        int64_t largest_timespan = params.nPowTargetTimespan*4;

        const arith_uint256 pow_limit = UintToArith256(params.powLimit);
        arith_uint256 observed_new_target;
        observed_new_target.SetCompact(new_nbits);

        // Calculate the largest difficulty value possible:
        arith_uint256 largest_difficulty_target;
        largest_difficulty_target.SetCompact(old_nbits);
        largest_difficulty_target *= largest_timespan;
        largest_difficulty_target /= params.nPowTargetTimespan;

        if (largest_difficulty_target > pow_limit) {
            largest_difficulty_target = pow_limit;
        }

        // Round and then compare this new calculated value to what is
        // observed.
        arith_uint256 maximum_new_target;
        maximum_new_target.SetCompact(largest_difficulty_target.GetCompact());
        if (maximum_new_target < observed_new_target) return false;

        // Calculate the smallest difficulty value possible:
        arith_uint256 smallest_difficulty_target;
        smallest_difficulty_target.SetCompact(old_nbits);
        smallest_difficulty_target *= smallest_timespan;
        smallest_difficulty_target /= params.nPowTargetTimespan;

        if (smallest_difficulty_target > pow_limit) {
            smallest_difficulty_target = pow_limit;
        }

        // Round and then compare this new calculated value to what is
        // observed.
        arith_uint256 minimum_new_target;
        minimum_new_target.SetCompact(smallest_difficulty_target.GetCompact());
        if (minimum_new_target > observed_new_target) return false;
    } else if (old_nbits != new_nbits) {
        return false;
    }
    return true;
}